

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O2

int is_all_static_array_dimens(char *str)

{
  char *in_RAX;
  char *pcVar1;
  char *end;
  
  while( true ) {
    end = in_RAX;
    pcVar1 = strchr(str,0x5b);
    if (pcVar1 == (char *)0x0) {
      return 1;
    }
    in_RAX = (char *)strtol(pcVar1 + 1,&end,0);
    if (*end != ']') break;
    str = end + 1;
  }
  return 0;
}

Assistant:

static int
is_all_static_array_dimens(const char *str)
{
    char *left_paren, *end;

    if ((left_paren = strchr(str, '[')) == NULL) {
	return 1;
    }	
    (void) strtol(left_paren + 1, &end, 0);
    if (*end != ']') {
	return 0;
    } else {
	return is_all_static_array_dimens(end+1);
    }
}